

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O0

bool Js::VarIs<Js::JavascriptAsyncGenerator>(Var aValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool local_12;
  bool isRecyclableObject;
  Var aValue_local;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/RecyclableObject.h"
                                ,0x1ec,"(aValue != nullptr)","VarIs: aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_12 = false;
  if ((ulong)aValue >> 0x30 == 0) {
    local_12 = VarIsImpl<Js::JavascriptAsyncGenerator>((RecyclableObject *)aValue);
  }
  return local_12;
}

Assistant:

bool VarIs(Var aValue)
    {
        AssertMsg(aValue != nullptr, "VarIs: aValue is null");

#if INT32VAR
        bool isRecyclableObject = (((uintptr_t)aValue) >> VarTag_Shift) == 0;
#else
        bool isRecyclableObject = (((uintptr_t)aValue) & AtomTag) == AtomTag_Object;
#endif

        return isRecyclableObject && VarIsImpl<T>(reinterpret_cast<RecyclableObject*>(aValue));
    }